

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileNotFoundException.h
# Opt level: O1

void __thiscall
FileNotFoundException::FileNotFoundException(FileNotFoundException *this,string *filename)

{
  (this->super_CustomException).message._M_dataplus._M_p =
       (pointer)&(this->super_CustomException).message.field_2;
  (this->super_CustomException).message._M_string_length = 0;
  (this->super_CustomException).message.field_2._M_local_buf[0] = '\0';
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->filename);
  return;
}

Assistant:

FileNotFoundException( string filename ){this->filename=filename;}